

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

void __thiscall
helics::Endpoint::Endpoint
          (Endpoint *this,InterfaceVisibility locality,MessageFederate *mFed,string_view name,
          string_view type)

{
  string_view type_00;
  string_view eptName;
  string_view type_01;
  string_view eptName_00;
  Endpoint *this_00;
  char *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  Endpoint *in_stack_ffffffffffffff58;
  Endpoint *in_stack_ffffffffffffff60;
  MessageFederate *this_01;
  char *pcVar1;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  MessageFederate *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 *puVar2;
  
  this_01 = (MessageFederate *)&stack0x00000008;
  puVar2 = in_RDI;
  Interface::Interface(&in_stack_ffffffffffffff60->super_Interface);
  *in_RDI = &PTR__Endpoint_0094f958;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  in_RDI[9] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0x51) = 0;
  pcVar1 = (char *)(in_RDI + 0xb);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  if (in_ESI == 1) {
    eptName._M_str = in_stack_ffffffffffffff90;
    eptName._M_len = in_stack_ffffffffffffff88;
    type_00._M_str = pcVar1;
    type_00._M_len = (size_t)in_RDI;
    helics::MessageFederate::registerGlobalEndpoint(this_01,eptName,type_00);
    operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    eptName_00._M_str = in_RCX;
    eptName_00._M_len = (size_t)puVar2;
    type_01._M_str._0_4_ = in_stack_ffffffffffffffe0;
    type_01._M_len = in_RDX;
    type_01._M_str._4_4_ = in_ESI;
    this_00 = helics::MessageFederate::registerEndpoint
                        (in_stack_ffffffffffffffd0,eptName_00,type_01);
    operator=(this_00,in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

Endpoint::Endpoint(InterfaceVisibility locality,
                   MessageFederate* mFed,
                   std::string_view name,
                   std::string_view type)
{
    if (locality == InterfaceVisibility::GLOBAL) {
        operator=(mFed->registerGlobalEndpoint(name, type));
    } else {
        operator=(mFed->registerEndpoint(name, type));
    }
}